

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

bool __thiscall ON_CheckSum::CheckFile(ON_CheckSum *this,FILE *fp,bool bSkipTimeCheck)

{
  bool bVar1;
  ON__UINT32 current_remainder;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  time_t filetime;
  size_t filesize;
  uchar buffer [1024];
  time_t local_448;
  size_t local_440;
  undefined1 local_438 [1032];
  
  if (fp == (FILE *)0x0) {
    return false;
  }
  current_remainder = 0;
  local_440 = 0;
  local_448 = 0;
  bVar1 = ON::GetFileStats(fp,&local_440,(time_t *)0x0,&local_448);
  if ((!bVar1) || ((this->m_size == local_440 && ((bSkipTimeCheck || (this->m_time == local_448)))))
     ) {
    sVar6 = 0x400;
    lVar2 = 0x40000;
    uVar3 = 0;
    bVar1 = false;
    uVar4 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + lVar2;
      if (uVar4 < uVar7 && (int)sVar6 == 0x400) {
        while( true ) {
          sVar6 = fread(local_438,1,0x400,(FILE *)fp);
          uVar5 = (uint)sVar6;
          if ((int)uVar5 < 1) break;
          uVar4 = uVar4 + (uVar5 & 0x7fffffff);
          current_remainder = ON_CRC32(current_remainder,(ulong)(uVar5 & 0x7fffffff),local_438);
          if ((uVar5 != 0x400) || (uVar7 <= uVar4)) break;
        }
      }
      if (this->m_crc[uVar3] != current_remainder) break;
      lVar2 = lVar2 * 2;
      bVar1 = 5 < uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 7);
    if (bVar1) {
      if ((int)sVar6 == 0x400) {
        do {
          sVar6 = fread(local_438,1,0x400,(FILE *)fp);
          uVar5 = (uint)sVar6;
          if ((int)uVar5 < 1) break;
          uVar4 = uVar4 + (uVar5 & 0x7fffffff);
          current_remainder = ON_CRC32(current_remainder,(ulong)(uVar5 & 0x7fffffff),local_438);
        } while (uVar5 == 0x400);
      }
      if (this->m_crc[7] == current_remainder) {
        return uVar4 == this->m_size;
      }
    }
  }
  return false;
}

Assistant:

bool ON_CheckSum::CheckFile( 
  FILE* fp,
  bool bSkipTimeCheck
  ) const
{
  if ( !fp )
    return false;

  size_t filesize=0;
  time_t filetime=0;
  if ( ON::GetFileStats( fp, &filesize, nullptr, &filetime ) )
  {
    if ( m_size != filesize )
    {
      return false;
    }

    if ( !bSkipTimeCheck && m_time != filetime)
    {
      return false;
    }
  }

  unsigned char buffer[1024];
  int count=1024;
  ON__UINT32 crc = 0;
  size_t sz0 = 0, maxsize = 0x40000;
  size_t sz = 0;

  for( int i = 0; i < 7; i++ )
  {
    sz0 += maxsize;
    while(1024 == count && sz < sz0)
    {
      count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
      if ( count > 0 )
      {
        sz += count;
        crc = ON_CRC32( crc, count, buffer );
      }
    }
    maxsize *= 2;
    if ( m_crc[i] != crc )
      return false;
  }

  while(1024 == count)
  {
    count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
    if ( count > 0 )
    {
      sz += count;
      crc = ON_CRC32( crc, count, buffer );
    }
  }
  if (m_crc[7] != crc)
    return false;

  if ( sz != m_size )
    return false;

  return true;
}